

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O2

TimestampComponents *
duckdb::Timestamp::GetComponents(TimestampComponents *__return_storage_ptr__,timestamp_t timestamp)

{
  date_t date;
  dtime_t time;
  date_t local_24;
  dtime_t local_20;
  
  Convert(timestamp,&local_24,&local_20);
  Date::Convert(local_24,&__return_storage_ptr__->year,&__return_storage_ptr__->month,
                &__return_storage_ptr__->day);
  Time::Convert(local_20,&__return_storage_ptr__->hour,&__return_storage_ptr__->minute,
                &__return_storage_ptr__->second,&__return_storage_ptr__->microsecond);
  return __return_storage_ptr__;
}

Assistant:

TimestampComponents Timestamp::GetComponents(timestamp_t timestamp) {
	date_t date;
	dtime_t time;

	Convert(timestamp, date, time);

	TimestampComponents result;
	Date::Convert(date, result.year, result.month, result.day);
	Time::Convert(time, result.hour, result.minute, result.second, result.microsecond);
	return result;
}